

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

_Bool v7m_cpacr_pass(CPUARMState_conflict *env,_Bool is_secure,_Bool is_priv)

{
  uint32_t uVar1;
  _Bool is_priv_local;
  _Bool is_secure_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = extract32((env->v7m).cpacr[is_secure & 1],0x14,2);
  switch(uVar1) {
  case 0:
  case 2:
    env_local._7_1_ = 0;
    break;
  case 1:
    env_local._7_1_ = is_priv;
    break;
  case 3:
    env_local._7_1_ = 1;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
               ,0x406,(char *)0x0);
  }
  return (_Bool)env_local._7_1_;
}

Assistant:

static inline bool v7m_cpacr_pass(CPUARMState *env,
                                  bool is_secure, bool is_priv)
{
    switch (extract32(env->v7m.cpacr[is_secure], 20, 2)) {
    case 0:
    case 2: /* UNPREDICTABLE: we treat like 0 */
        return false;
    case 1:
        return is_priv;
    case 3:
        return true;
    default:
        g_assert_not_reached();
        // never reach here
        return true;
    }
}